

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O3

bool __thiscall testing::internal::FilePath::CreateFolder(FilePath *this)

{
  int iVar1;
  bool bVar2;
  StatStruct file_stat;
  stat sStack_98;
  
  iVar1 = mkdir((this->pathname_)._M_dataplus._M_p,0x1ff);
  bVar2 = true;
  if (iVar1 == -1) {
    iVar1 = stat((this->pathname_)._M_dataplus._M_p,&sStack_98);
    bVar2 = (sStack_98.st_mode & 0xf000) == 0x4000 && iVar1 == 0;
  }
  return bVar2;
}

Assistant:

bool FilePath::CreateFolder() const {
#if GTEST_OS_WINDOWS_MOBILE
  FilePath removed_sep(this->RemoveTrailingPathSeparator());
  LPCWSTR unicode = String::AnsiToUtf16(removed_sep.c_str());
  int result = CreateDirectory(unicode, nullptr) ? 0 : -1;
  delete [] unicode;
#elif GTEST_OS_WINDOWS
  int result = _mkdir(pathname_.c_str());
#elif GTEST_OS_ESP8266
  // do nothing
  int result = 0;
#else
  int result = mkdir(pathname_.c_str(), 0777);
#endif  // GTEST_OS_WINDOWS_MOBILE

  if (result == -1) {
    return this->DirectoryExists();  // An error is OK if the directory exists.
  }
  return true;  // No error.
}